

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O3

void __thiscall
TPZMatrix<Fad<float>_>::MultAdd
          (TPZMatrix<Fad<float>_> *this,TPZFMatrix<Fad<float>_> *x,TPZFMatrix<Fad<float>_> *y,
          TPZFMatrix<Fad<float>_> *z,Fad<float> *alpha,Fad<float> *beta,int opt)

{
  float fVar1;
  uint uVar2;
  long lVar3;
  Fad<float> *pFVar4;
  float fVar5;
  int iVar6;
  uint uVar7;
  long lVar8;
  float *pfVar9;
  float *pfVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  float *pfVar14;
  float *pfVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  Fad<float> val;
  long local_110;
  Fad<float> local_f8;
  Fad<float> local_d8;
  long local_b8;
  TPZFMatrix<Fad<float>_> *local_b0;
  FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_> local_a8;
  float *local_98;
  Fad<float> local_90;
  Fad<float> *local_70;
  Fad<float> *local_68;
  Fad<float> **local_60;
  Fad<float> *local_58;
  Fad<float> local_50;
  
  if (opt == 0) {
    lVar8 = (this->super_TPZBaseMatrix).fCol;
    if (lVar8 == (x->super_TPZMatrix<Fad<float>_>).super_TPZBaseMatrix.fRow) goto LAB_00c82421;
  }
  else {
    lVar8 = (x->super_TPZMatrix<Fad<float>_>).super_TPZBaseMatrix.fRow;
LAB_00c82421:
    if ((this->super_TPZBaseMatrix).fRow == lVar8) goto LAB_00c8243a;
  }
  Error("Operator* <matrices with incompatible dimensions>",(char *)0x0);
LAB_00c8243a:
  local_110 = (x->super_TPZMatrix<Fad<float>_>).super_TPZBaseMatrix.fCol;
  if ((local_110 != (y->super_TPZMatrix<Fad<float>_>).super_TPZBaseMatrix.fCol) ||
     ((x->super_TPZMatrix<Fad<float>_>).super_TPZBaseMatrix.fRow !=
      (y->super_TPZMatrix<Fad<float>_>).super_TPZBaseMatrix.fRow)) {
    Error("TPZFMatrix::MultiplyAdd incompatible dimensions\n",(char *)0x0);
    local_110 = (x->super_TPZMatrix<Fad<float>_>).super_TPZBaseMatrix.fCol;
  }
  lVar8 = (this->super_TPZBaseMatrix).fRow;
  lVar3 = (this->super_TPZBaseMatrix).fCol;
  local_90.val_ = beta->val_;
  uVar2 = (beta->dx_).num_elts;
  local_90.dx_.ptr_to_data = (float *)0x0;
  local_90.dx_.num_elts = uVar2;
  if ((long)(int)uVar2 != 0) {
    uVar13 = 0xffffffffffffffff;
    if (-1 < (int)uVar2) {
      uVar13 = (long)(int)uVar2 << 2;
    }
    local_90.dx_.ptr_to_data = (float *)operator_new__(uVar13);
    MEM_CPY<float>::copy
              ((MEM_CPY<float> *)local_90.dx_.ptr_to_data,(EVP_PKEY_CTX *)(beta->dx_).ptr_to_data,
               (EVP_PKEY_CTX *)(ulong)uVar2);
  }
  local_90.defaultVal = beta->defaultVal;
  local_b0 = x;
  PrepareZ(this,y,z,&local_90,opt);
  Fad<float>::~Fad(&local_90);
  local_f8.val_ = 0.0;
  local_f8.dx_.num_elts = 0;
  local_f8.dx_.ptr_to_data = (float *)0x0;
  local_f8.defaultVal = 0.0;
  if (0 < local_110) {
    local_98 = &alpha->defaultVal;
    local_b8 = 0;
    lVar11 = 0;
    do {
      if (opt == 0) {
        if (0 < lVar3) {
          lVar18 = 0;
          do {
            if (0 < lVar8) {
              lVar17 = 0;
              lVar16 = 0;
              do {
                lVar12 = (z->super_TPZMatrix<Fad<float>_>).super_TPZBaseMatrix.fRow;
                if ((lVar12 <= lVar16) ||
                   ((z->super_TPZMatrix<Fad<float>_>).super_TPZBaseMatrix.fCol <= lVar11)) {
                  TPZFMatrix<Fad<float>_>::Error
                            ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                lVar12 = lVar12 * local_b8;
                pFVar4 = z->fElem;
                (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                          (&local_d8,this,lVar16,lVar18);
                local_70 = alpha;
                local_68 = &local_d8;
                (*(local_b0->super_TPZMatrix<Fad<float>_>).super_TPZBaseMatrix.super_TPZSavable.
                  _vptr_TPZSavable[0x24])(&local_50,local_b0,lVar18,lVar11);
                local_a8.fadexpr_.left_ = (Fad<float> *)((long)&pFVar4->val_ + lVar17 + lVar12);
                local_60 = &local_70;
                local_a8.fadexpr_.right_ = (Fad<float> *)&local_60;
                local_58 = &local_50;
                Fad<float>::operator=
                          (&local_f8,
                           (FadExpr<FadBinaryAdd<Fad<float>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>,_Fad<float>_>_>_>_>
                            *)&local_a8);
                Fad<float>::~Fad(&local_50);
                Fad<float>::~Fad(&local_d8);
                (*(z->super_TPZMatrix<Fad<float>_>).super_TPZBaseMatrix.super_TPZSavable.
                  _vptr_TPZSavable[0x23])(z,lVar16,lVar11,&local_f8);
                lVar16 = lVar16 + 1;
                lVar17 = lVar17 + 0x20;
              } while (lVar8 != lVar16);
            }
            lVar18 = lVar18 + 1;
          } while (lVar18 != lVar3);
        }
      }
      else if (0 < lVar8) {
        lVar18 = 0;
        do {
          local_f8.val_ = 0.0;
          if (local_f8.dx_.num_elts != 0) {
            local_d8.val_ = 0.0;
            Vector<float>::operator=(&local_f8.dx_,&local_d8.val_);
          }
          if (0 < lVar3) {
            lVar16 = 0;
            do {
              (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                        (&local_d8,this,lVar16,lVar18);
              (*(local_b0->super_TPZMatrix<Fad<float>_>).super_TPZBaseMatrix.super_TPZSavable.
                _vptr_TPZSavable[0x24])(&local_50,local_b0,lVar16,lVar11);
              local_a8.fadexpr_.left_ = &local_d8;
              local_a8.fadexpr_.right_ = &local_50;
              Fad<float>::operator+=(&local_f8,&local_a8);
              Fad<float>::~Fad(&local_50);
              Fad<float>::~Fad(&local_d8);
              lVar16 = lVar16 + 1;
            } while (lVar3 != lVar16);
          }
          iVar6 = local_f8.dx_.num_elts;
          fVar5 = local_f8.val_;
          fVar1 = alpha->val_;
          local_d8.val_ = fVar1 * local_f8.val_;
          uVar2 = (alpha->dx_).num_elts;
          uVar7 = local_f8.dx_.num_elts;
          if (local_f8.dx_.num_elts < (int)uVar2) {
            uVar7 = uVar2;
          }
          local_d8.dx_.num_elts = 0;
          local_d8.dx_.ptr_to_data = (float *)0x0;
          if (0 < (int)uVar7) {
            local_d8.dx_.num_elts = uVar7;
            local_d8.dx_.ptr_to_data = (float *)operator_new__((ulong)uVar7 * 4);
            local_d8.defaultVal = 0.0;
            pfVar9 = (alpha->dx_).ptr_to_data;
            uVar13 = 0;
            pfVar10 = local_f8.dx_.ptr_to_data;
            do {
              pfVar14 = pfVar9;
              if (uVar2 == 0) {
                pfVar14 = local_98;
              }
              pfVar15 = pfVar10;
              if (iVar6 == 0) {
                pfVar15 = &local_f8.defaultVal;
              }
              local_d8.dx_.ptr_to_data[uVar13] = *pfVar14 * fVar5 + *pfVar15 * fVar1;
              uVar13 = uVar13 + 1;
              pfVar10 = pfVar10 + 1;
              pfVar9 = pfVar9 + 1;
            } while (uVar7 != uVar13);
          }
          local_d8.defaultVal = 0.0;
          (*(z->super_TPZMatrix<Fad<float>_>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
            [0x23])(z,lVar18,lVar11,&local_d8);
          Fad<float>::~Fad(&local_d8);
          lVar18 = lVar18 + 1;
        } while (lVar18 != lVar8);
      }
      lVar11 = lVar11 + 1;
      local_b8 = local_b8 + 0x20;
    } while (lVar11 != local_110);
  }
  Fad<float>::~Fad(&local_f8);
  return;
}

Assistant:

void TPZMatrix<TVar>::MultAdd(const TPZFMatrix<TVar> &x,const TPZFMatrix<TVar> &y, TPZFMatrix<TVar> &z, const TVar alpha,const TVar beta,const int opt) const {
	if ((!opt && Cols() != x.Rows()) || Rows() != x.Rows())
		Error( "Operator* <matrices with incompatible dimensions>" );
	if(x.Cols() != y.Cols() || x.Rows() != y.Rows()) {
		Error ("TPZFMatrix::MultiplyAdd incompatible dimensions\n");
	}
	int64_t rows = Rows();
	int64_t cols = Cols();
	int64_t xcols = x.Cols();
	int64_t ic, c, r;
	PrepareZ(y,z,beta,opt);
	TVar val = 0.;
	for (ic = 0; ic < xcols; ic++) {
		if(!opt) {
			for ( c = 0; c<cols; c++) {
				for ( r = 0; r < rows; r++ ) {
					val = z(r,ic) + alpha * GetVal(r,c) * x.GetVal(c,ic);
					z.PutVal(r,ic,val);
				}
			}
		} else {
			for (r = 0; r<rows; r++) {
            	val = 0.;
				for(c = 0; c<cols; c++) {
					val += GetVal(c,r)* x.GetVal(c,ic);
				}
				z.PutVal(r,ic,alpha*val);
			}
		}
	}
}